

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Reader.cpp
# Opt level: O0

int __thiscall ninx::lexer::Reader::get_next_limiter(Reader *this)

{
  bool bVar1;
  int iVar2;
  bool comments_ignored;
  int next_char;
  Reader *this_local;
  
  this_local._4_4_ = std::istream::peek();
  if (this_local._4_4_ < 0) {
    this_local._4_4_ = -1;
  }
  else if (this_local._4_4_ == 0x5c) {
    this_local._4_4_ = -2;
  }
  else if (this_local._4_4_ == 0x2d) {
    std::istream::get();
    iVar2 = std::istream::peek();
    iVar2 = isdigit(iVar2);
    if (iVar2 == 0) {
      ignore_spaces(this);
    }
    else {
      std::istream::seekg((long)this->stream,~_S_beg);
      this_local._4_4_ = -2;
    }
  }
  else if ((this_local._4_4_ == 0x2f) && (bVar1 = ignore_comment(this), bVar1)) {
    this_local._4_4_ = get_next_limiter(this);
  }
  else {
    bVar1 = is_limiter((char)this_local._4_4_);
    if (bVar1) {
      std::istream::get();
      if (this_local._4_4_ == 0x7b) {
        ignore_spaces_and_newline(this);
      }
      else if (this_local._4_4_ == 0x7d) {
        ignore_spaces(this);
      }
      else if (this_local._4_4_ == 0x3d) {
        ignore_spaces(this);
      }
    }
    else {
      this_local._4_4_ = -2;
    }
  }
  return this_local._4_4_;
}

Assistant:

int ninx::lexer::Reader::get_next_limiter() {
    int next_char = this->stream.peek();
    if (next_char >= 0) {
        if (next_char == '\\') {  // Escape char check
            return FOUND_TEXT;
        }else{
            if(next_char == '-') {  // Negative number handling
                this->stream.get();

                // Check if the next entry is a digit
                if (isdigit(this->stream.peek())) {
                    this->stream.seekg(-1, std::ios_base::cur);
                    return FOUND_TEXT;
                }

                // Also ignore the trailing spaces
                this->ignore_spaces();

                return next_char;
            }

            if (next_char == '/') {  // Comments handling
                bool comments_ignored { this->ignore_comment() };
                if (comments_ignored) {
                    return this->get_next_limiter();
                }
            }

            // Check if the char is a limiter
            if (is_limiter(static_cast<char>(next_char))) {
                // If the char is a limiter, consume it
                this->stream.get();

                // Also ignore the trailing spaces
                // Check if it is the beginning of a block, in that case remove also the new lines
                if (next_char == '{') {
                    this->ignore_spaces_and_newline();
                }else if (next_char == '}') {
                    this->ignore_spaces();
                }else if (next_char == '='){
                    this->ignore_spaces();
                }

                return next_char;
            }else{
                return FOUND_TEXT;
            }
        }
    }else{  // EOF
        return FOUND_EOF;
    }
}